

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshfile_operations.cpp
# Opt level: O3

void facemap_scanner(map<int,_face_properties,_std::less<int>,_std::allocator<std::pair<const_int,_face_properties>_>_>
                     *faces_map,int *face_map_index,face_properties *current_face)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  _Base_ptr p_Var4;
  _Self __tmp;
  pair<int,_face_properties> local_48;
  
  if ((faces_map->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    local_48.first = *face_map_index + 1;
    *face_map_index = local_48.first;
  }
  else {
    p_Var4 = (faces_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(faces_map->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var1) {
      iVar2 = current_face->first_node;
      iVar3 = current_face->second_node;
      do {
        if ((iVar2 == *(int *)&p_Var4[1].field_0x4) && (iVar3 == *(int *)&p_Var4[1]._M_parent)) {
          if (*(int *)&p_Var4[1]._M_left == current_face->parent_materials[0]) {
            *(undefined4 *)((long)&p_Var4[1]._M_parent + 4) = 3;
            *(int *)((long)&p_Var4[1]._M_left + 4) = current_face->parent_materials[0];
            return;
          }
          *(undefined4 *)((long)&p_Var4[1]._M_parent + 4) = 2;
          *(int *)((long)&p_Var4[1]._M_left + 4) = current_face->parent_materials[0];
          std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (&p_Var4[1]._M_left,&p_Var4[1]._M_right,2);
          std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>
                    (&p_Var4[1]._M_left,&p_Var4[1]._M_right);
          return;
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    }
    local_48.first = *face_map_index + 1;
    *face_map_index = local_48.first;
  }
  local_48.second.first_node = current_face->first_node;
  local_48.second.second_node = current_face->second_node;
  local_48.second.face_type = current_face->face_type;
  local_48.second.parent_materials[0] = current_face->parent_materials[0];
  local_48.second.parent_materials[1] = current_face->parent_materials[1];
  std::
  _Rb_tree<int,std::pair<int_const,face_properties>,std::_Select1st<std::pair<int_const,face_properties>>,std::less<int>,std::allocator<std::pair<int_const,face_properties>>>
  ::_M_emplace_unique<std::pair<int,face_properties>>
            ((_Rb_tree<int,std::pair<int_const,face_properties>,std::_Select1st<std::pair<int_const,face_properties>>,std::less<int>,std::allocator<std::pair<int_const,face_properties>>>
              *)faces_map,&local_48);
  return;
}

Assistant:

void facemap_scanner(std::map<int, face_properties> &faces_map, int &face_map_index, face_properties &current_face)
{
    std::map<int, face_properties>::iterator face_map_searcher_iterator = faces_map.begin();
    bool face_already_exists = false;
    bool current_face_has_been_added = false;
    if (faces_map.empty() == false)
    {
        while (face_map_searcher_iterator != faces_map.end())
        {
            face_already_exists = compare_faces(current_face, face_map_searcher_iterator->second);
            if (face_already_exists == true) //update face data to change type and append parent materials
            {
                // if parent materials match -> make insider
                if (face_map_searcher_iterator->second.parent_materials[0] == current_face.parent_materials[0])
                {
                    face_map_searcher_iterator->second.face_type = 3; //face=insider
                    face_map_searcher_iterator->second.parent_materials[1] = current_face.parent_materials[0];
                }
                // if parent materials don't match -> make interface and add the second reference material
                else
                {
                    face_map_searcher_iterator->second.face_type = 2; //face=interface
                    face_map_searcher_iterator->second.parent_materials[1] = current_face.parent_materials[0];
                    int n = sizeof(face_map_searcher_iterator->second.parent_materials) / sizeof(face_map_searcher_iterator->second.parent_materials[0]);
                    std::sort(face_map_searcher_iterator->second.parent_materials, face_map_searcher_iterator->second.parent_materials + n);
                }
                current_face_has_been_added = true;
                face_map_searcher_iterator = faces_map.end(); //break from the loop as we have found the second and only face.
            }
            else
            {
                face_map_searcher_iterator++;
            }
        }
        if (current_face_has_been_added == false) // Add the element as no previous reference was found.
        {
            faces_map.insert(std::pair<int, face_properties>(++face_map_index, current_face));
        }

    }
    else // Add the element as there can't possibly be one already.
    {
        faces_map.insert(std::pair<int, face_properties>(++face_map_index, current_face));
    }
}